

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O0

bool __thiscall leveldb::log::Reader::SkipToInitialBlock(Reader *this)

{
  bool bVar1;
  ulong uVar2;
  Status local_30;
  Status skip_status;
  uint64_t block_start_location;
  size_t offset_in_block;
  Reader *this_local;
  
  uVar2 = this->initial_offset_ & 0x7fff;
  skip_status.state_ = (char *)(this->initial_offset_ - uVar2);
  if (0x7ffa < uVar2) {
    skip_status.state_ = skip_status.state_ + 0x8000;
  }
  this->end_of_buffer_offset_ = (uint64_t)skip_status.state_;
  if (skip_status.state_ != (char *)0x0) {
    (*this->file_->_vptr_SequentialFile[3])(&local_30,this->file_,skip_status.state_);
    bVar1 = Status::ok(&local_30);
    if (!bVar1) {
      ReportDrop(this,(uint64_t)skip_status.state_,&local_30);
      this_local._7_1_ = 0;
    }
    Status::~Status(&local_30);
    if (!bVar1) goto LAB_0014cc89;
  }
  this_local._7_1_ = 1;
LAB_0014cc89:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Reader::SkipToInitialBlock() {
  const size_t offset_in_block = initial_offset_ % kBlockSize;
  uint64_t block_start_location = initial_offset_ - offset_in_block;

  // Don't search a block if we'd be in the trailer
  if (offset_in_block > kBlockSize - 6) {
    block_start_location += kBlockSize;
  }

  end_of_buffer_offset_ = block_start_location;

  // Skip to start of first block that can contain the initial record
  if (block_start_location > 0) {
    Status skip_status = file_->Skip(block_start_location);
    if (!skip_status.ok()) {
      ReportDrop(block_start_location, skip_status);
      return false;
    }
  }

  return true;
}